

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_physfs.c
# Opt level: O3

int cmd_getsearchpath(char *args)

{
  long lVar1;
  undefined8 *puVar2;
  undefined8 uVar3;
  char *__s;
  ulong uVar4;
  
  puVar2 = (undefined8 *)PHYSFS_getSearchPath();
  if (puVar2 == (undefined8 *)0x0) {
    uVar3 = PHYSFS_getLastError();
    printf("Failure. reason: %s.\n",uVar3);
  }
  else {
    uVar4 = 0;
    __s = (char *)*puVar2;
    while (__s != (char *)0x0) {
      puts(__s);
      lVar1 = uVar4 + 1;
      uVar4 = uVar4 + 1;
      __s = (char *)puVar2[lVar1];
    }
    printf("\n total (%d) directories.\n",uVar4 & 0xffffffff);
    PHYSFS_freeList(puVar2);
  }
  return 1;
}

Assistant:

static int cmd_getsearchpath(char *args)
{
    char **rc = PHYSFS_getSearchPath();

    if (rc == NULL)
        printf("Failure. reason: %s.\n", PHYSFS_getLastError());
    else
    {
        int dir_count;
        char **i;
        for (i = rc, dir_count = 0; *i != NULL; i++, dir_count++)
            printf("%s\n", *i);

        printf("\n total (%d) directories.\n", dir_count);
        PHYSFS_freeList(rc);
    } /* else */

    return 1;
}